

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IObject.h
# Opt level: O0

void __thiscall IObject::GetInterface(IObject *this,InterfaceID iid,void **pReturn)

{
  void **pReturn_local;
  InterfaceID iid_local;
  IObject *this_local;
  
  if (iid == 0) {
    *pReturn = this;
  }
  else {
    *pReturn = (void *)0x0;
  }
  return;
}

Assistant:

virtual void GetInterface( InterfaceID iid, void** pReturn )
	{
		switch( iid )
		{
		case IID_IOBJECT:
			*pReturn = this;
			break;
		default:
			*pReturn = NULL;
		}
	}